

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int mbedtls_ssl_write_handshake_msg_ext
              (mbedtls_ssl_context *ssl,int update_checksum,int force_flush)

{
  uchar uVar1;
  uchar *puVar2;
  uchar *puVar3;
  ushort uVar4;
  int iVar5;
  size_t __n;
  uchar hs_type;
  size_t hs_len;
  int ret;
  int force_flush_local;
  int update_checksum_local;
  mbedtls_ssl_context *ssl_local;
  
  __n = ssl->out_msglen - 4;
  uVar1 = *ssl->out_msg;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0xae4,"=> write handshake message");
  if ((ssl->out_msgtype == 0x16) || (ssl->out_msgtype == 0x14)) {
    if (((ssl->out_msgtype == 0x16) && (uVar1 == '\0')) ||
       (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)) {
      if (((ssl->conf->transport == '\x01') &&
          (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)) &&
         (ssl->handshake->retransmit_state == '\x01')) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xafc,"should never happen");
        ssl_local._4_4_ = -0x6c00;
      }
      else if (ssl->out_msglen < 0x401) {
        if (ssl->out_msgtype == 0x16) {
          ssl->out_msg[1] = (uchar)(__n >> 0x10);
          ssl->out_msg[2] = (uchar)(__n >> 8);
          ssl->out_msg[3] = (uchar)__n;
          if (ssl->conf->transport == '\x01') {
            if (0x400 - ssl->out_msglen < 8) {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0xb29,"DTLS handshake message too large: size %zu, maximum %zu",__n,0x3f4)
              ;
              return -0x7100;
            }
            memmove(ssl->out_msg + 0xc,ssl->out_msg + 4,__n);
            ssl->out_msglen = ssl->out_msglen + 8;
            if (uVar1 == '\0') {
              ssl->out_msg[4] = '\0';
              ssl->out_msg[5] = '\0';
            }
            else {
              uVar4 = (ushort)ssl->handshake->out_msg_seq;
              mbedtls_put_unaligned_uint16(ssl->out_msg + 4,uVar4 << 8 | uVar4 >> 8);
              ssl->handshake->out_msg_seq = ssl->handshake->out_msg_seq + 1;
            }
            memset(ssl->out_msg + 6,0,3);
            puVar2 = ssl->out_msg;
            puVar3 = ssl->out_msg;
            *(undefined2 *)(puVar2 + 9) = *(undefined2 *)(puVar3 + 1);
            puVar2[0xb] = puVar3[3];
          }
          if (((uVar1 != '\0') && (update_checksum != 0)) &&
             (iVar5 = (*ssl->handshake->update_checksum)(ssl,ssl->out_msg,ssl->out_msglen),
             iVar5 != 0)) {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0xb45,"update_checksum",iVar5);
            return iVar5;
          }
        }
        if ((ssl->conf->transport == '\x01') && ((ssl->out_msgtype != 0x16 || (uVar1 != '\0')))) {
          iVar5 = ssl_flight_append(ssl);
          if (iVar5 != 0) {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0xb51,"ssl_flight_append",iVar5);
            return iVar5;
          }
        }
        else {
          iVar5 = mbedtls_ssl_write_record(ssl,force_flush);
          if (iVar5 != 0) {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0xb58,"ssl_write_record",iVar5);
            return iVar5;
          }
        }
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xb5d,"<= write handshake message");
        ssl_local._4_4_ = 0;
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xb0e,"Record too large: size %zu, maximum %zu",ssl->out_msglen,0x400);
        ssl_local._4_4_ = -0x6c00;
      }
    }
    else {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0xaf4,"should never happen");
      ssl_local._4_4_ = -0x6c00;
    }
  }
  else {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0xaeb,"should never happen");
    ssl_local._4_4_ = -0x6c00;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_write_handshake_msg_ext(mbedtls_ssl_context *ssl,
                                        int update_checksum,
                                        int force_flush)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const size_t hs_len = ssl->out_msglen - 4;
    const unsigned char hs_type = ssl->out_msg[0];

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> write handshake message"));

    /*
     * Sanity checks
     */
    if (ssl->out_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE          &&
        ssl->out_msgtype != MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    /* Whenever we send anything different from a
     * HelloRequest we should be in a handshake - double check. */
    if (!(ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
          hs_type          == MBEDTLS_SSL_HS_HELLO_REQUEST) &&
        ssl->handshake == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }
#endif

    /* Double-check that we did not exceed the bounds
     * of the outgoing record buffer.
     * This should never fail as the various message
     * writing functions must obey the bounds of the
     * outgoing record buffer, but better be safe.
     *
     * Note: We deliberately do not check for the MTU or MFL here.
     */
    if (ssl->out_msglen > MBEDTLS_SSL_OUT_CONTENT_LEN) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("Record too large: "
                                  "size %" MBEDTLS_PRINTF_SIZET
                                  ", maximum %" MBEDTLS_PRINTF_SIZET,
                                  ssl->out_msglen,
                                  (size_t) MBEDTLS_SSL_OUT_CONTENT_LEN));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    /*
     * Fill handshake headers
     */
    if (ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE) {
        ssl->out_msg[1] = MBEDTLS_BYTE_2(hs_len);
        ssl->out_msg[2] = MBEDTLS_BYTE_1(hs_len);
        ssl->out_msg[3] = MBEDTLS_BYTE_0(hs_len);

        /*
         * DTLS has additional fields in the Handshake layer,
         * between the length field and the actual payload:
         *      uint16 message_seq;
         *      uint24 fragment_offset;
         *      uint24 fragment_length;
         */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
            /* Make room for the additional DTLS fields */
            if (MBEDTLS_SSL_OUT_CONTENT_LEN - ssl->out_msglen < 8) {
                MBEDTLS_SSL_DEBUG_MSG(1, ("DTLS handshake message too large: "
                                          "size %" MBEDTLS_PRINTF_SIZET ", maximum %"
                                          MBEDTLS_PRINTF_SIZET,
                                          hs_len,
                                          (size_t) (MBEDTLS_SSL_OUT_CONTENT_LEN - 12)));
                return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
            }

            memmove(ssl->out_msg + 12, ssl->out_msg + 4, hs_len);
            ssl->out_msglen += 8;

            /* Write message_seq and update it, except for HelloRequest */
            if (hs_type != MBEDTLS_SSL_HS_HELLO_REQUEST) {
                MBEDTLS_PUT_UINT16_BE(ssl->handshake->out_msg_seq, ssl->out_msg, 4);
                ++(ssl->handshake->out_msg_seq);
            } else {
                ssl->out_msg[4] = 0;
                ssl->out_msg[5] = 0;
            }

            /* Handshake hashes are computed without fragmentation,
             * so set frag_offset = 0 and frag_len = hs_len for now */
            memset(ssl->out_msg + 6, 0x00, 3);
            memcpy(ssl->out_msg + 9, ssl->out_msg + 1, 3);
        }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        /* Update running hashes of handshake messages seen */
        if (hs_type != MBEDTLS_SSL_HS_HELLO_REQUEST && update_checksum != 0) {
            ret = ssl->handshake->update_checksum(ssl, ssl->out_msg,
                                                  ssl->out_msglen);
            if (ret != 0) {
                MBEDTLS_SSL_DEBUG_RET(1, "update_checksum", ret);
                return ret;
            }
        }
    }

    /* Either send now, or just save to be sent (and resent) later */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        !(ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
          hs_type          == MBEDTLS_SSL_HS_HELLO_REQUEST)) {
        if ((ret = ssl_flight_append(ssl)) != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "ssl_flight_append", ret);
            return ret;
        }
    } else
#endif
    {
        if ((ret = mbedtls_ssl_write_record(ssl, force_flush)) != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_record", ret);
            return ret;
        }
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= write handshake message"));

    return 0;
}